

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

TypeDescriptor * __thiscall
CallStatement::evaluateCallExpr
          (CallStatement *this,SymTab *symTab,
          vector<Statement_*,_std::allocator<Statement_*>_> *stack,string *id)

{
  TypeDescriptor *extraout_RAX;
  Function *this_00;
  allocator<char> aStack_21;
  
  this_00 = (Function *)&std::cout;
  std::operator<<((ostream *)&std::cout,"HERE");
  Function::Function(this_00);
  this_00[1].super_Statement._statements.
  super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this_00[1].super_Statement._vptr_Statement = (_func_int **)0x0;
  this_00[1].super_Statement.indentState = 0;
  this_00[1].super_Statement.isFunction = false;
  *(undefined3 *)&this_00[1].super_Statement.field_0xd = 0;
  (this_00->super_Statement)._vptr_Statement = (_func_int **)&PTR_print_00117b80;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &this_00[1].super_Statement._statements.
              super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
              super__Vector_impl_data._M_finish,"",&aStack_21);
  this_00[1]._id.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[1]._id.field_2 + 8) = 0;
  this_00[1]._id._M_dataplus._M_p = (pointer)0x0;
  this_00[1]._id._M_string_length = 0;
  this_00[1].super_Statement._id.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[1].super_Statement._id.field_2 + 8) = 0;
  return extraout_RAX;
}

Assistant:

TypeDescriptor *CallStatement::evaluateCallExpr(SymTab &symTab,std::vector<Statement*>stack,std::string id) {
//    Functions().setStack();
    //or(int i = 0; i < )
    std::cout << "HERE";
    //std::vector<Statement*>stack = this->_functionStack;
    for(int i = 0; i < stack.size();i++){
        //stack[i]->id();
    }
//    if(findFunction(this)){
//        Function *function = returnFunction(this);
//        SymTab symTab1;
//        for(int i = 0; i < function->paramenters().size(); i++){
//            //symTab1.setValueFor(function->pa)
//        }
//        function->evaluate(symTab1);
//    }
    //return nullptr;
}